

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::insert
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this,
          BindingMap *svBindings,LeafData *ld)

{
  TermList **ppTVar1;
  long *plVar2;
  UnresolvedSplitRecord *pUVar3;
  UnresolvedSplitRecord *pUVar4;
  undefined4 uVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  Entry *pEVar8;
  Entry *pEVar9;
  uint64_t uVar10;
  BindingMap *__filename;
  bool bVar11;
  char cVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  Node *pNVar16;
  Entry *pEVar17;
  undefined4 extraout_var;
  Node *pNVar18;
  undefined4 extraout_var_00;
  Node **leaf;
  TermList TVar19;
  ulong uVar20;
  long *plVar21;
  undefined **ppuVar22;
  undefined4 extraout_var_02;
  Binding *pBVar23;
  TermList *this_00;
  Term *t;
  TermList tt;
  Binding *pBVar24;
  long lVar25;
  Entry *pEVar26;
  Node **inode;
  TermList *pTVar27;
  Term *s;
  Top TVar28;
  undefined1 auVar29 [16];
  TermList term_1;
  uint boundVar_1;
  TermList term;
  uint boundVar;
  undefined1 local_128 [12];
  bool bStack_11c;
  undefined3 uStack_11b;
  Value local_118;
  undefined4 local_fc;
  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
  local_f8;
  LeafData *local_d8;
  BindingMap *local_d0;
  TermList local_c8;
  undefined4 local_bc;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *local_b8;
  uint64_t local_b0;
  Clause *local_a8;
  uint local_a0;
  char local_9c;
  ulong local_98;
  int iStack_90;
  undefined4 uStack_8c;
  undefined1 uStack_88;
  undefined3 uStack_87;
  undefined1 uStack_84;
  undefined7 uStack_83;
  undefined4 local_7c;
  Clause *local_78;
  uint local_70;
  char local_6c;
  ulong local_68;
  int iStack_60;
  undefined4 uStack_5c;
  undefined1 uStack_58;
  undefined3 local_57;
  undefined1 uStack_54;
  undefined7 uStack_53;
  undefined4 local_4c;
  undefined4 extraout_var_01;
  
  inode = &this->_root;
  local_d8 = ld;
  local_b8 = this;
  if (this->_root == (Node *)0x0) {
    if (svBindings->_size == 0) {
      pNVar16 = (Node *)Lib::FixedSizeAllocator<32UL>::alloc
                                  ((FixedSizeAllocator<32UL> *)
                                   (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      (pNVar16->_term)._content = 2;
      pNVar16->_vptr_Node = (_func_int **)&PTR__UListLeaf_00b2c400;
      pNVar16[1]._vptr_Node = (_func_int **)0x0;
      *(undefined4 *)&pNVar16[1]._term._content = 0;
      bVar11 = (local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
               super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
               ._isSome;
      if (bVar11 == false) {
        local_fc = *(undefined4 *)
                    &(local_d8->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
        uVar13 = (local_d8->super_SelectedSummand).super_SelectedLiteral.litIdx;
        local_128._0_8_ = (local_d8->super_SelectedSummand).super_SelectedLiteral.cl;
      }
      else {
        uVar5 = *(undefined4 *)
                 ((long)&(local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                         super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                         ._elem._elem + 0x11);
        uVar7 = *(undefined8 *)
                 ((long)&(local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                         super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                         ._elem._elem + 9);
        local_fc = *(undefined4 *)
                    &(local_d8->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
        uVar13 = (local_d8->super_SelectedSummand).super_SelectedLiteral.litIdx;
        local_128._0_8_ = (local_d8->super_SelectedSummand).super_SelectedLiteral.cl;
        local_118._21_7_ = 0;
        local_118._0_5_ =
             *(uint5 *)&(local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                        ._elem._elem & 0xffffffff03;
        local_118._5_3_ = 0;
        local_118._9_3_ = (undefined3)uVar7;
        local_118._8_4_ = (uint)(uint3)local_118._9_3_ << 8;
        local_118._12_4_ = (undefined4)((ulong)uVar7 >> 0x18);
        local_118.init._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        .
        super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ._content[0xf] = (char)((ulong)uVar7 >> 0x38);
        local_118._17_3_ = (undefined3)uVar5;
        local_118.init._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        .
        super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ._content[0x13] = (char)((uint)uVar5 >> 0x18);
      }
      stack0xfffffffffffffee0 = CONCAT14(bVar11,uVar13);
      Lib::List<Inferences::ALASCA::FourierMotzkinConf::Rhs>::push
                ((Rhs *)local_128,
                 (List<Inferences::ALASCA::FourierMotzkinConf::Rhs> **)(pNVar16 + 1));
      *(int *)&pNVar16[1]._term._content = (int)pNVar16[1]._term._content + 1;
      *inode = pNVar16;
      return;
    }
    uVar13 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
             getOneKey(svBindings);
    pNVar16 = (Node *)Lib::FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    (pNVar16->_term)._content = 2;
    *(uint *)&pNVar16[1]._vptr_Node = uVar13;
    pNVar16->_vptr_Node = (_func_int **)&PTR__UArrIntermediateNode_00b2c5a0;
    *(undefined4 *)((long)&pNVar16[1]._vptr_Node + 4) = 0;
    pNVar16[1]._term._content = 0;
    *inode = pNVar16;
  }
  if (svBindings->_size == 0) {
    ensureLeafEfficiency((Leaf **)inode);
    local_6c = (local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
               super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
               ._isSome;
    if ((bool)local_6c == false) {
      local_4c = *(undefined4 *)&(local_d8->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
      local_70 = (local_d8->super_SelectedSummand).super_SelectedLiteral.litIdx;
      local_78 = (local_d8->super_SelectedSummand).super_SelectedLiteral.cl;
    }
    else {
      uVar5 = *(undefined4 *)
               ((long)&(local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem + 0x11);
      uVar7 = *(undefined8 *)
               ((long)&(local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem + 9);
      local_4c = *(undefined4 *)&(local_d8->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
      local_70 = (local_d8->super_SelectedSummand).super_SelectedLiteral.litIdx;
      local_78 = (local_d8->super_SelectedSummand).super_SelectedLiteral.cl;
      uStack_53 = 0;
      local_68 = (ulong)(*(uint5 *)&(local_d8->super_SelectedSummand).super_SelectedLiteral.
                                    interpreted.
                                    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                    ._elem._elem & 0xffffffff03);
      iStack_60._1_3_ = (uint3)uVar7;
      iStack_60 = (uint)iStack_60._1_3_ << 8;
      uStack_5c = (undefined4)((ulong)uVar7 >> 0x18);
      uStack_58 = (undefined1)((ulong)uVar7 >> 0x38);
      local_57 = (undefined3)uVar5;
      uStack_54 = (undefined1)((uint)uVar5 >> 0x18);
    }
    (*(*inode)->_vptr_Node[9])();
    return;
  }
  if (insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::FourierMotzkinConf::Rhs)
      ::unresolvedSplits == '\0') {
    insert();
  }
  insert::unresolvedSplits._size = 0;
  local_d0 = svBindings;
LAB_0032adf6:
  do {
    iVar14 = (*(*inode)->_vptr_Node[2])();
    if ((char)iVar14 == '\0') {
      iVar14 = (*(*inode)->_vptr_Node[5])();
      if (iVar14 != 1) goto LAB_0032af26;
      pNVar16 = *inode;
      iVar14 = (*pNVar16->_vptr_Node[4])(pNVar16);
      if (iVar14 != 1) goto LAB_0032af26;
      local_f8._size = *(uint *)&pNVar16[1]._vptr_Node;
      pNVar18 = (Node *)pNVar16[1]._term._content;
      pEVar17 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
                findEntry(svBindings,&local_f8._size);
      if (pEVar17 == (Entry *)0x0) {
        uVar20 = (pNVar18->_term)._content;
        if (((uVar20 & 3) == 0) && ((*(byte *)(uVar20 + 0x28) & 8) == 0)) goto LAB_0032af26;
LAB_0032aea7:
        uVar13 = *(uint *)&pNVar16[1]._vptr_Node;
        if (insert::unresolvedSplits._capacity == insert::unresolvedSplits._size) {
          Lib::
          BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
          ::expand(&insert::unresolvedSplits);
        }
        pUVar4 = insert::unresolvedSplits._data1;
        uVar15 = insert::unresolvedSplits._size + 1;
        insert::unresolvedSplits._size = uVar15;
        insert::unresolvedSplits._data1[uVar15].var = uVar13;
        pUVar4[uVar15].original._content = uVar20;
        Lib::
        BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
        ::bubbleUp(&insert::unresolvedSplits,insert::unresolvedSplits._size);
        (pNVar18->_term)._content = (pNVar16->_term)._content;
        *inode = pNVar18;
        (pNVar16->_term)._content = 2;
        (*pNVar16->_vptr_Node[0xc])(pNVar16);
        (*pNVar16->_vptr_Node[1])(pNVar16);
        goto LAB_0032adf6;
      }
      local_128._0_4_ = local_f8._size;
      pEVar17 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
                findEntry(svBindings,(uint *)local_128);
      local_128._0_8_ = (pEVar17->_val)._content;
      TVar28 = Kernel::TermList::top((TermList *)local_128);
      iVar14 = (*pNVar16->_vptr_Node[10])
                         (pNVar16,TVar28._inner._inner._0_8_,
                          (ulong)(TVar28._inner._inner._8_4_ & 0xff),0);
      if (CONCAT44(extraout_var,iVar14) == 0) {
        uVar20 = (pNVar18->_term)._content;
        goto LAB_0032aea7;
      }
      bVar11 = true;
    }
    else {
LAB_0032af26:
      bVar11 = false;
    }
    if ((insert::unresolvedSplits._size != 0) && (!bVar11 && insert::unresolvedSplits._size != 0)) {
      do {
        pUVar4 = insert::unresolvedSplits._data;
        uVar13 = (insert::unresolvedSplits._data)->var;
        local_b0 = ((insert::unresolvedSplits._data)->original)._content;
        uVar15 = insert::unresolvedSplits._size - 1;
        insert::unresolvedSplits._size = uVar15;
        if (uVar15 != 0) {
          local_128._0_8_ = *(undefined8 *)insert::unresolvedSplits._data;
          unique0x10000759 = (TermList **)((insert::unresolvedSplits._data)->original)._content;
          pUVar3 = insert::unresolvedSplits._data + uVar15;
          uVar5 = *(undefined4 *)&pUVar3->field_0x4;
          uVar6 = (pUVar3->original)._content;
          pUVar4->var = pUVar3->var;
          *(undefined4 *)&pUVar4->field_0x4 = uVar5;
          (pUVar4->original)._content = uVar6;
          pUVar4 = pUVar4 + uVar15;
          *(undefined8 *)pUVar4 = local_128._0_8_;
          (pUVar4->original)._content = (uint64_t)unique0x10000759;
          Lib::
          BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
          ::bubbleDown(&insert::unresolvedSplits,1);
        }
        pNVar16 = *inode;
        uVar6 = (pNVar16->_term)._content;
        pNVar18 = (Node *)Lib::FixedSizeAllocator<64UL>::alloc
                                    ((FixedSizeAllocator<64UL> *)
                                     (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
        (pNVar18->_term)._content = uVar6;
        *(uint *)&pNVar18[1]._vptr_Node = uVar13;
        pNVar18->_vptr_Node = (_func_int **)&PTR__UArrIntermediateNode_00b2c5a0;
        *(undefined4 *)((long)&pNVar18[1]._vptr_Node + 4) = 0;
        pNVar18[1]._term._content = 0;
        (pNVar16->_term)._content = local_b0;
        *inode = pNVar18;
        TVar28 = Kernel::TermList::top(&pNVar16->_term);
        iVar14 = (*pNVar18->_vptr_Node[10])
                           (pNVar18,TVar28._inner._inner._0_8_,
                            (ulong)(TVar28._inner._inner._8_4_ & 0xff),1);
        *(Node **)CONCAT44(extraout_var_00,iVar14) = pNVar16;
      } while (insert::unresolvedSplits._size != 0);
    }
    __filename = local_d0;
    pNVar16 = *inode;
    local_bc = *(undefined4 *)&pNVar16[1]._vptr_Node;
    local_128._0_4_ = local_bc;
    pEVar17 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
              findEntry(local_d0,(uint *)local_128);
    local_c8._content = (pEVar17->_val)._content;
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::remove
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
               &stack0xffffffffffffffb8,(char *)__filename);
    this_00 = &local_c8;
    TVar28 = Kernel::TermList::top(this_00);
    iVar14 = (*pNVar16->_vptr_Node[10])
                       (pNVar16,TVar28._inner._inner._0_8_,
                        (ulong)(TVar28._inner._inner._8_4_ & 0xff),1);
    leaf = (Node **)CONCAT44(extraout_var_01,iVar14);
    if (*leaf == (Node *)0x0) {
      local_f8._size = 0;
      local_f8._capacity = 0;
      local_f8._data = (Binding *)0x0;
      local_f8._data1 = (Binding *)0x0;
      plVar21 = (long *)::operator_new(0x28);
      ppuVar22 = &PTR__IteratorCore_00b28a90;
      *plVar21 = (long)&PTR__IteratorCore_00b28a90;
      pEVar17 = local_d0->_entries;
      plVar21[2] = (long)pEVar17;
      pEVar8 = local_d0->_afterLast;
      plVar21[3] = (long)pEVar8;
      uVar13 = local_d0->_timestamp;
      *(uint *)(plVar21 + 4) = uVar13;
      *(undefined4 *)(plVar21 + 1) = 1;
      if (pEVar17 == pEVar8) goto LAB_0032b52f;
      lVar25 = 0;
      pEVar9 = pEVar17;
      goto LAB_0032b500;
    }
    pTVar27 = &(*leaf)->_term;
    local_128._0_8_ = (Clause *)0x40;
    register0x00000000 = (TermList **)::operator_new(0x200,0x10);
    local_118._8_8_ = register0x00000000 + local_128._0_8_;
    local_118._0_8_ = register0x00000000;
LAB_0032b0ab:
    while( true ) {
      tt._content = this_00->_content;
      TVar19._content = tt._content;
      if (tt._content == pTVar27->_content) break;
      bVar11 = Kernel::TermList::sameTop((TermList)pTVar27->_content,tt);
      TVar19._content = pTVar27->_content;
      tt._content = this_00->_content;
      if (!bVar11) break;
      if ((((Term *)TVar19._content)->_args[0]._content & 8) != 0) {
        TVar19._content = (uint64_t)Kernel::Term::cloneNonShared(TVar19._content);
        pTVar27->_content = TVar19._content;
      }
      uVar20 = (ulong)(*(uint *)&((Term *)TVar19._content)->field_0xc & 0xfffffff);
      pTVar27 = ((Term *)TVar19._content)->_args + uVar20;
      this_00 = (TermList *)
                ((ulong)(*(uint *)(tt._content + 0xc) & 0xfffffff) * 8 + 0x28 + tt._content);
      if ((((Term *)TVar19._content)->_args[uVar20 - 1]._content & 3) != 2) {
        if (local_118._0_8_ == local_118._8_8_) {
          Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_128);
        }
        *(TermList **)local_118._0_8_ = ((Term *)TVar19._content)->_args + (uVar20 - 1);
        local_118._0_8_ = local_118._0_8_ + 8;
        if (local_118._0_8_ == local_118._8_8_) {
          Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_128);
        }
        goto LAB_0032b277;
      }
    }
    bVar11 = Kernel::TermList::sameTop(TVar19,tt);
    if (!bVar11) {
      uVar20 = pTVar27->_content;
      if ((~(uint)uVar20 & 3) == 0) {
        uVar13 = (uint)(uVar20 >> 2);
      }
      else {
        uVar13 = local_b8->_nextVar;
        local_b8->_nextVar = uVar13 + 1;
        if (insert::unresolvedSplits._capacity == insert::unresolvedSplits._size) {
          Lib::
          BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
          ::expand(&insert::unresolvedSplits);
        }
        pUVar4 = insert::unresolvedSplits._data1;
        uVar15 = insert::unresolvedSplits._size + 1;
        insert::unresolvedSplits._size = uVar15;
        insert::unresolvedSplits._data1[uVar15].var = uVar13;
        pUVar4[uVar15].original._content = uVar20;
        Lib::
        BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
        ::bubbleUp(&insert::unresolvedSplits,insert::unresolvedSplits._size);
        pTVar27->_content = (ulong)(uVar13 * 4 + 3);
      }
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                (local_d0,uVar13,(TermList)this_00->_content);
    }
    svBindings = local_d0;
    if ((TermList **)local_118._0_8_ != stack0xfffffffffffffee0) goto code_r0x0032b210;
    iVar14 = local_d0->_size;
    if (iVar14 == 0) {
      ensureLeafEfficiency((Leaf **)leaf);
      local_9c = (local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                 super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                 ._isSome;
      if ((bool)local_9c == false) {
        local_7c = *(undefined4 *)
                    &(local_d8->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
        local_a0 = (local_d8->super_SelectedSummand).super_SelectedLiteral.litIdx;
        local_a8 = (local_d8->super_SelectedSummand).super_SelectedLiteral.cl;
      }
      else {
        uVar5 = *(undefined4 *)
                 ((long)&(local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                         super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                         ._elem._elem + 0x11);
        uVar7 = *(undefined8 *)
                 ((long)&(local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                         super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                         ._elem._elem + 9);
        local_7c = *(undefined4 *)
                    &(local_d8->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
        local_a0 = (local_d8->super_SelectedSummand).super_SelectedLiteral.litIdx;
        local_a8 = (local_d8->super_SelectedSummand).super_SelectedLiteral.cl;
        uStack_83 = 0;
        local_98 = (ulong)(*(uint5 *)&(local_d8->super_SelectedSummand).super_SelectedLiteral.
                                      interpreted.
                                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                      ._elem._elem & 0xffffffff03);
        iStack_90._1_3_ = (uint3)uVar7;
        iStack_90 = (uint)iStack_90._1_3_ << 8;
        uStack_8c = (undefined4)((ulong)uVar7 >> 0x18);
        uStack_88 = (undefined1)((ulong)uVar7 >> 0x38);
        uStack_87 = (undefined3)uVar5;
        uStack_84 = (undefined1)((uint)uVar5 >> 0x18);
      }
      (*((Node *)&(*leaf)->_vptr_Node)->_vptr_Node[9])(*leaf,&local_a8);
    }
    if (stack0xfffffffffffffee0 != (TermList **)0x0) {
      uVar20 = local_128._0_8_ * 8 + 0xfU & 0xfffffffffffffff0;
      if (uVar20 == 0) {
        *stack0xfffffffffffffee0 = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = stack0xfffffffffffffee0;
      }
      else if (uVar20 < 0x11) {
        *stack0xfffffffffffffee0 = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = stack0xfffffffffffffee0;
      }
      else if (uVar20 < 0x19) {
        *stack0xfffffffffffffee0 = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = stack0xfffffffffffffee0;
      }
      else if (uVar20 < 0x21) {
        *stack0xfffffffffffffee0 = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = stack0xfffffffffffffee0;
      }
      else if (uVar20 < 0x31) {
        *stack0xfffffffffffffee0 = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = stack0xfffffffffffffee0;
      }
      else if (uVar20 < 0x41) {
        *stack0xfffffffffffffee0 = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = stack0xfffffffffffffee0;
      }
      else {
        operator_delete(stack0xfffffffffffffee0,0x10);
      }
    }
    inode = leaf;
    if (iVar14 == 0) {
      return;
    }
  } while( true );
LAB_0032b796:
  uVar13 = *auVar29._0_8_;
  uVar6 = *auVar29._8_8_;
  if (local_f8._capacity == local_f8._size) {
    Lib::
    BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
    ::expand(&local_f8);
  }
  uVar15 = local_f8._size + 1;
  local_f8._size = uVar15;
  local_f8._data1[uVar15].var = uVar13;
  local_f8._data1[uVar15].term._content = uVar6;
  if (1 < uVar15) {
    uVar20 = (ulong)uVar15;
    do {
      uVar20 = uVar20 >> 1;
      if (local_f8._data1[uVar15].var <= local_f8._data1[uVar20].var) break;
      pBVar23 = local_f8._data1 + uVar15;
      pBVar24 = local_f8._data1 + uVar20;
      local_128._0_8_ = *(undefined8 *)pBVar23;
      unique0x10000819 = (TermList **)(pBVar23->term)._content;
      uVar5 = *(undefined4 *)&pBVar24->field_0x4;
      uVar6 = (pBVar24->term)._content;
      pBVar23->var = pBVar24->var;
      *(undefined4 *)&pBVar23->field_0x4 = uVar5;
      (pBVar23->term)._content = uVar6;
      *(undefined8 *)pBVar24 = local_128._0_8_;
      (pBVar24->term)._content = (uint64_t)unique0x10000819;
      bVar11 = 3 < uVar15;
      uVar15 = (uint)uVar20;
    } while (bVar11);
  }
  cVar12 = (**(code **)(*plVar21 + 0x10))(plVar21);
  if (cVar12 == '\0') goto LAB_0032b82d;
  auVar29 = (**(code **)(*plVar21 + 0x18))(plVar21);
  goto LAB_0032b796;
LAB_0032b82d:
  plVar2 = plVar21 + 1;
  *(int *)plVar2 = (int)*plVar2 + -1;
  if ((int)*plVar2 != 0) goto LAB_0032b53c;
  ppuVar22 = (undefined **)*plVar21;
  goto LAB_0032b536;
code_r0x0032b210:
  this_00 = *(TermList **)(local_118._0_8_ + -8);
  ppTVar1 = (TermList **)(local_118._0_8_ + -0x10);
  pTVar27 = *(TermList **)(local_118._0_8_ + -0x10);
  local_118._0_8_ = ppTVar1;
  if ((((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar27 + -1))->_vars & 3) != 2) {
    if (ppTVar1 == (TermList **)local_118._8_8_) {
      Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_128);
    }
    *(anon_union_8_2_f154dc0f_for_Term_10 **)local_118._0_8_ =
         (anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar27 + -1);
    local_118._0_8_ = local_118._0_8_ + 8;
    if (local_118._0_8_ == local_118._8_8_) {
      Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_128);
    }
LAB_0032b277:
    *(TermList **)local_118._0_8_ = this_00 + -1;
    local_118._0_8_ = local_118._0_8_ + 8;
  }
  goto LAB_0032b0ab;
  while (lVar25 = lVar25 + -0x10, pEVar9 = pEVar26, pEVar26 != pEVar8) {
LAB_0032b500:
    pEVar26 = pEVar9 + 1;
    uVar15 = (pEVar9->field_0)._infoData;
    plVar21[2] = (long)pEVar26;
    if ((uVar15 & 1) == 0 && uVar15 >> 2 == uVar13) {
      auVar29._8_8_ = (long)pEVar17 + (8 - lVar25);
      auVar29._0_8_ = (long)pEVar17 + (4 - lVar25);
      goto LAB_0032b796;
    }
  }
LAB_0032b52f:
  *(undefined4 *)(plVar21 + 1) = 0;
LAB_0032b536:
  (*(code *)ppuVar22[1])(plVar21);
LAB_0032b53c:
  while (TVar19._content = local_c8._content, local_f8._size != 0) {
    uVar13 = (local_f8._data)->var;
    uVar6 = ((local_f8._data)->term)._content;
    uVar15 = local_f8._size - 1;
    local_f8._size = uVar15;
    if (uVar15 != 0) {
      local_128._0_8_ = *(undefined8 *)local_f8._data;
      unique0x100007b9 = (TermList **)((local_f8._data)->term)._content;
      pBVar23 = local_f8._data + uVar15;
      uVar5 = *(undefined4 *)&pBVar23->field_0x4;
      uVar10 = (pBVar23->term)._content;
      (local_f8._data)->var = pBVar23->var;
      *(undefined4 *)&(local_f8._data)->field_0x4 = uVar5;
      ((local_f8._data)->term)._content = uVar10;
      *(undefined8 *)(local_f8._data + uVar15) = local_128._0_8_;
      local_f8._data[uVar15].term._content = (uint64_t)unique0x100007b9;
      Lib::
      BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
      ::bubbleDown(&local_f8,1);
    }
    TVar19._content = local_c8._content;
    pNVar16 = (Node *)Lib::FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    (pNVar16->_term)._content = TVar19._content;
    *(uint *)&((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node = uVar13;
    ((Node *)&pNVar16->_vptr_Node)->_vptr_Node = (_func_int **)&PTR__UArrIntermediateNode_00b2c5a0;
    *(undefined4 *)((long)&((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node + 4) = 0;
    pNVar16[1]._term._content = 0;
    *leaf = pNVar16;
    local_c8._content = uVar6;
    TVar28 = Kernel::TermList::top(&local_c8);
    iVar14 = (*((Node *)&pNVar16->_vptr_Node)->_vptr_Node[10])
                       (pNVar16,TVar28._inner._inner._0_8_,
                        (ulong)(TVar28._inner._inner._8_4_ & 0xff),1);
    leaf = (Node **)CONCAT44(extraout_var_02,iVar14);
  }
  pNVar16 = (Node *)Lib::FixedSizeAllocator<32UL>::alloc
                              ((FixedSizeAllocator<32UL> *)
                               (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  (pNVar16->_term)._content = TVar19._content;
  ((Node *)&pNVar16->_vptr_Node)->_vptr_Node = (_func_int **)&PTR__UListLeaf_00b2c400;
  ((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node = (_func_int **)0x0;
  *(undefined4 *)&pNVar16[1]._term._content = 0;
  *leaf = pNVar16;
  bVar11 = (local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
           super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
           ._isSome;
  if (bVar11 == false) {
    local_fc = *(undefined4 *)&(local_d8->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
    uVar13 = (local_d8->super_SelectedSummand).super_SelectedLiteral.litIdx;
    local_128._0_8_ = (local_d8->super_SelectedSummand).super_SelectedLiteral.cl;
  }
  else {
    uVar5 = *(undefined4 *)
             ((long)&(local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._elem._elem + 0x11);
    lVar25 = *(long *)((long)&(local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                              ._elem._elem + 9);
    local_fc = *(undefined4 *)&(local_d8->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
    uVar13 = (local_d8->super_SelectedSummand).super_SelectedLiteral.litIdx;
    local_128._0_8_ = (local_d8->super_SelectedSummand).super_SelectedLiteral.cl;
    local_118._21_7_ = 0;
    local_118._0_5_ =
         *(uint5 *)&(local_d8->super_SelectedSummand).super_SelectedLiteral.interpreted.
                    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ._elem._elem & 0xffffffff03;
    local_118._5_3_ = 0;
    local_118._8_8_ = lVar25 << 8;
    local_118.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0xf] = (char)((ulong)lVar25 >> 0x38);
    local_118._17_3_ = (undefined3)uVar5;
    local_118.init._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    .
    super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ._content[0x13] = (char)((uint)uVar5 >> 0x18);
  }
  stack0xfffffffffffffee0 = CONCAT14(bVar11,uVar13);
  Lib::List<Inferences::ALASCA::FourierMotzkinConf::Rhs>::push
            ((Rhs *)local_128,(List<Inferences::ALASCA::FourierMotzkinConf::Rhs> **)(pNVar16 + 1));
  *(int *)&pNVar16[1]._term._content = (int)pNVar16[1]._term._content + 1;
  ensureIntermediateNodeEfficiency((IntermediateNode **)inode);
  Lib::
  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
  ::~BinaryHeap(&local_f8);
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::insert(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_INSERT(0, "insert: ", svBindings, " into ", *this)

  if(*pnode == 0) {
    if (svBindings.isEmpty()) {
      auto leaf = createLeaf();
      leaf->insert(std::move(ld));
      *pnode = leaf;
      DEBUG_INSERT(0, "out: ", *this);
      return;
    } else {
      *pnode=createIntermediateNode(svBindings.getOneKey());
    }
  }
  if(svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    static_cast<Leaf*>(*pnode)->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  typedef BinaryHeap<UnresolvedSplitRecord, BindingComparator<LeafData_>> SplitRecordHeap;
  static SplitRecordHeap unresolvedSplits;
  unresolvedSplits.reset();

  ASS((*pnode));
  ASS(!(*pnode)->isLeaf());

start:

#if REORDERING
  ASS(!(*pnode)->isLeaf() || !unresolvedSplits.isEmpty());
  bool canPostponeSplits=false;
  if((*pnode)->isLeaf() || (*pnode)->algorithm()!=UNSORTED_LIST) {
    canPostponeSplits=false;
  } else {
    UArrIntermediateNode* inode = static_cast<UArrIntermediateNode*>(*pnode);
    canPostponeSplits = inode->size()==1;
    if(canPostponeSplits) {
      unsigned boundVar=inode->childVar;
      Node* child=inode->_nodes[0];
      bool removeProblematicNode=false;
      if(svBindings.find(boundVar)) {
	TermList term=svBindings.get(boundVar);
	bool wouldDescendIntoChild = inode->childByTop(term.top(),false)!=0;
	ASS_EQ(wouldDescendIntoChild, TermList::sameTop(term, child->term()));
	if(!wouldDescendIntoChild) {
	  //if we'd have to perform all postponed splitting due to
	  //node with a single child, we rather remove that node
	  //from the tree and deal with the binding, it represented,
	  //later.
	  removeProblematicNode=true;
	}
      } else if(!child->term().isTerm() || child->term().term()->shared()) {
	//We can remove nodes binding to special variables undefined in our branch
	//of the tree, as long as we're sure, that during split resolving we put these
	//binding nodes below nodes that define spec. variables they bind.
	removeProblematicNode=true;
      } else {
	canPostponeSplits = false;
      }
      if(removeProblematicNode) {
	unresolvedSplits.insert(UnresolvedSplitRecord(inode->childVar, child->term()));
	child->setTerm(inode->term());
	*pnode=child;
	inode->makeEmpty();
	delete inode;
	goto start;
      }
    }
  }
  canPostponeSplits|=unresolvedSplits.isEmpty();
  if(!canPostponeSplits) {

    while(!unresolvedSplits.isEmpty()) {
      UnresolvedSplitRecord urr=unresolvedSplits.pop();

      Node* node=*pnode;
      IntermediateNode* newNode = createIntermediateNode(node->term(), urr.var);
      node->setTerm(urr.original);

      *pnode=newNode;

      Node** nodePosition=newNode->childByTop(node->top(), true);
      ASS(!*nodePosition);
      *nodePosition=node;
    }
  }
#endif
  ASS(!(*pnode)->isLeaf());

  IntermediateNode* inode = static_cast<IntermediateNode*>(*pnode);
  ASS(inode);

  unsigned boundVar=inode->childVar;
  TermList term=svBindings.get(boundVar);
  svBindings.remove(boundVar);

  //Into pparent we store the node, we might be inserting into.
  //So in the case we do insert, we might check whether this node
  //needs expansion.
  Node** pparent=pnode;
  pnode=inode->childByTop(term.top(),true);

  if (*pnode == 0) {
    BinaryHeap<Binding, BindingComparator<LeafData_>> remainingBindings;
    for (auto [var, term] : iterTraits(svBindings.items())) {
      remainingBindings.insert(Binding(var, term));
    }
    while (!remainingBindings.isEmpty()) {
      Binding b=remainingBindings.pop();
      IntermediateNode* inode = createIntermediateNode(term, b.var);
      term=b.term;

      *pnode = inode;
      pnode = inode->childByTop(term.top(),true);
    }
    Leaf* lnode=createLeaf(term);
    *pnode=lnode;
    lnode->insert(ld);

    ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pparent));
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }


  TermList* tt = &term;
  TermList* ss = &(*pnode)->term();

  ASS(TermList::sameTop(*ss, *tt));


  // ss is the term in node, tt is the term to be inserted
  // ss and tt have the same top symbols but are not equal
  // create the common subterm of ss,tt and an alternative node
  Stack<TermList*> subterms(64);
  for (;;) {
    if (*tt!=*ss && TermList::sameTop(*ss,*tt)) {
      // ss and tt have the same tops and are different, so must be non-variables
      ASS(! ss->isVar());
      ASS(! tt->isVar());

      Term* s = ss->term();
      Term* t = tt->term();

      ASS(s->arity() > 0);
      ASS(s->functor() == t->functor());

      if (s->shared()) {
        // create a shallow copy of s
        s = Term::cloneNonShared(s);
        ss->setTerm(s);
      }

      ss = s->args();
      tt = t->args();
      if (ss->next()->isEmpty()) {
        continue;
      }
      subterms.push(ss->next());
      subterms.push(tt->next());
    } else {
      if (! TermList::sameTop(*ss,*tt)) {
        unsigned x;
        if(!ss->isSpecialVar()) {
          x = _nextVar++;
        #if REORDERING
          unresolvedSplits.insert(UnresolvedSplitRecord(x,*ss));
          ss->makeSpecialVar(x);
        #else
          Node::split(pnode,ss,x);
        #endif
        } else {
          x=ss->var();
        }
        svBindings.set(x,*tt);
      }

      if (subterms.isEmpty()) {
        break;
      }
      tt = subterms.pop();
      ss = subterms.pop();
      if (! ss->next()->isEmpty()) {
        subterms.push(ss->next());
        subterms.push(tt->next());
      }
    }
  }

  if (svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    Leaf* leaf = static_cast<Leaf*>(*pnode);
    leaf->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  goto start;
}